

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

StrongWeakPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StrongWeakPropertyExprSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SequenceExprSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,SequenceExprSyntax *args_2,Token *args_3)

{
  Token keyword;
  Token openParen;
  Token closeParen;
  StrongWeakPropertyExprSyntax *this_00;
  
  this_00 = (StrongWeakPropertyExprSyntax *)allocate(this,0x48,8);
  keyword.kind = args->kind;
  keyword._2_1_ = args->field_0x2;
  keyword.numFlags.raw = (args->numFlags).raw;
  keyword.rawLen = args->rawLen;
  keyword.info = args->info;
  openParen.kind = args_1->kind;
  openParen._2_1_ = args_1->field_0x2;
  openParen.numFlags.raw = (args_1->numFlags).raw;
  openParen.rawLen = args_1->rawLen;
  openParen.info = args_1->info;
  closeParen.kind = args_3->kind;
  closeParen._2_1_ = args_3->field_0x2;
  closeParen.numFlags.raw = (args_3->numFlags).raw;
  closeParen.rawLen = args_3->rawLen;
  closeParen.info = args_3->info;
  slang::syntax::StrongWeakPropertyExprSyntax::StrongWeakPropertyExprSyntax
            (this_00,keyword,openParen,args_2,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }